

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

wchar_t terminal_settc(EditLine *el,wchar_t argc,wchar_t **argv)

{
  termcapstr *ptVar1;
  int iVar2;
  undefined4 uVar3;
  wchar_t wVar4;
  char *pcVar5;
  long lVar6;
  short *psVar7;
  wchar_t *pwVar8;
  FILE *__stream;
  termcapstr *t;
  ulong uVar9;
  bool bVar10;
  char how [8];
  char what [8];
  char *ep;
  undefined4 local_50;
  EditLine *local_48;
  short local_40;
  char local_3e;
  char *local_38;
  
  if (argv == (wchar_t **)0x0) {
    return L'\xffffffff';
  }
  if (argv[1] == (wchar_t *)0x0) {
    return L'\xffffffff';
  }
  if (argv[2] == (wchar_t *)0x0) {
    return L'\xffffffff';
  }
  pcVar5 = ct_encode_string(argv[1],&el->el_scratch);
  strlcpy((char *)&local_40,pcVar5,8);
  pcVar5 = ct_encode_string(argv[2],&el->el_scratch);
  strlcpy((char *)&local_50,pcVar5,8);
  t = tstr;
  if (local_3e == '\0' && local_40 == 0x6c61) {
    bVar10 = false;
  }
  else {
    do {
      ptVar1 = t + 1;
      bVar10 = ptVar1->name == (char *)0x0;
      if (bVar10) goto LAB_00111916;
      t = t + 1;
      iVar2 = strcmp(ptVar1->name,(char *)&local_40);
    } while (iVar2 != 0);
  }
  if (!bVar10) {
    terminal_alloc(el,t,(char *)&local_50);
    goto LAB_00111971;
  }
LAB_00111916:
  local_48 = el;
  if (local_3e == '\0' && local_40 == 0x6d61) {
    bVar10 = false;
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    do {
      pcVar5 = *(char **)((long)&tval[1].name + uVar9);
      bVar10 = pcVar5 == (char *)0x0;
      if (bVar10) goto LAB_00111987;
      iVar2 = strcmp(pcVar5,(char *)&local_40);
      uVar9 = uVar9 + 0x10;
    } while (iVar2 != 0);
  }
  if (bVar10) {
LAB_00111987:
    __stream = (FILE *)local_48->el_errfile;
    pwVar8 = *argv;
    pcVar5 = "%ls: Bad capability `%s\'.\n";
    psVar7 = &local_40;
    goto LAB_00111a28;
  }
  if (uVar9 < 0x20 || (uVar9 & 0x7fffffffffffffd0) == 0x40) {
    if (local_50 == 0x736579) {
      uVar3 = 1;
    }
    else {
      if (local_50._2_1_ != '\0' || (short)local_50 != 0x6f6e) {
        __stream = (FILE *)local_48->el_errfile;
        goto LAB_00111a19;
      }
      uVar3 = 0;
    }
    *(undefined4 *)((long)(local_48->el_terminal).t_val + (uVar9 >> 2)) = uVar3;
    el = local_48;
LAB_00111971:
    terminal_setflags(el);
    return L'\0';
  }
  lVar6 = strtol((char *)&local_50,&local_38,10);
  if (*local_38 == '\0') {
    pwVar8 = (local_48->el_terminal).t_val;
    *(int *)((long)pwVar8 + (uVar9 >> 2)) = (int)lVar6;
    if (uVar9 == 0x20) {
      (local_48->el_terminal).t_size.h = pwVar8[2];
    }
    else {
      if (uVar9 != 0x30) {
        return L'\0';
      }
      (local_48->el_terminal).t_size.v = pwVar8[3];
    }
    wVar4 = terminal_change_size(local_48,pwVar8[2],pwVar8[3]);
    if (wVar4 != L'\xffffffff') {
      return L'\0';
    }
    return L'\xffffffff';
  }
  __stream = (FILE *)local_48->el_errfile;
LAB_00111a19:
  pwVar8 = *argv;
  pcVar5 = "%ls: Bad value `%s\'.\n";
  psVar7 = (short *)&local_50;
LAB_00111a28:
  fprintf(__stream,pcVar5,pwVar8,psVar7);
  return L'\xffffffff';
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_settc(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv)
{
	const struct termcapstr *ts;
	const struct termcapval *tv;
	char what[8], how[8];
	long i;
	char *ep;

	if (argv == NULL || argv[1] == NULL || argv[2] == NULL)
		return -1;

	strlcpy(what, ct_encode_string(argv[1], &el->el_scratch), sizeof(what));
	strlcpy(how,  ct_encode_string(argv[2], &el->el_scratch), sizeof(how));

	/*
         * Do the strings first
         */
	for (ts = tstr; ts->name != NULL; ts++)
		if (strcmp(ts->name, what) == 0)
			break;

	if (ts->name != NULL) {
		terminal_alloc(el, ts, how);
		terminal_setflags(el);
		return 0;
	}
	/*
         * Do the numeric ones second
         */
	for (tv = tval; tv->name != NULL; tv++)
		if (strcmp(tv->name, what) == 0)
			break;

	if (tv->name == NULL) {
		(void) fprintf(el->el_errfile,
		    "%ls: Bad capability `%s'.\n", argv[0], what);
		return -1;
	}

	if (tv == &tval[T_pt] || tv == &tval[T_km] ||
	    tv == &tval[T_am] || tv == &tval[T_xn]) {
		/*
		 * Booleans
		 */
		if (strcmp(how, "yes") == 0)
			el->el_terminal.t_val[tv - tval] = 1;
		else if (strcmp(how, "no") == 0)
			el->el_terminal.t_val[tv - tval] = 0;
		else {
			(void) fprintf(el->el_errfile,
			    "%ls: Bad value `%s'.\n", argv[0], how);
			return -1;
		}
		terminal_setflags(el);
		return 0;
	}

	/*
	 * Numerics
	 */
	i = strtol(how, &ep, 10);
	if (*ep != '\0') {
		(void) fprintf(el->el_errfile,
		    "%ls: Bad value `%s'.\n", argv[0], how);
		return -1;
	}
	el->el_terminal.t_val[tv - tval] = (int) i;
	i = 0;
	if (tv == &tval[T_co]) {
		el->el_terminal.t_size.v = Val(T_co);
		i++;
	} else if (tv == &tval[T_li]) {
		el->el_terminal.t_size.h = Val(T_li);
		i++;
	}
	if (i && terminal_change_size(el, Val(T_li), Val(T_co)) == -1)
		return -1;
	return 0;
}